

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void length_encoder_reset(lzma_length_encoder *lencoder,uint32_t num_pos_states,_Bool fast_mode)

{
  uint local_2c;
  uint local_28;
  uint32_t bt_i_2;
  uint32_t bt_i_1;
  uint32_t bt_i;
  size_t pos_state;
  _Bool fast_mode_local;
  uint32_t num_pos_states_local;
  lzma_length_encoder *lencoder_local;
  
  lencoder->choice = 0x400;
  lencoder->choice2 = 0x400;
  for (_bt_i_1 = 0; _bt_i_1 < num_pos_states; _bt_i_1 = _bt_i_1 + 1) {
    for (bt_i_2 = 0; bt_i_2 < 8; bt_i_2 = bt_i_2 + 1) {
      lencoder->low[_bt_i_1][bt_i_2] = 0x400;
    }
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      lencoder->mid[_bt_i_1][local_28] = 0x400;
    }
  }
  for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
    lencoder->high[local_2c] = 0x400;
  }
  if (!fast_mode) {
    for (_bt_i_1 = 0; _bt_i_1 < num_pos_states; _bt_i_1 = _bt_i_1 + 1) {
      length_update_prices(lencoder,(uint32_t)_bt_i_1);
    }
  }
  return;
}

Assistant:

static void
length_encoder_reset(lzma_length_encoder *lencoder,
		const uint32_t num_pos_states, const bool fast_mode)
{
	size_t pos_state;

	bit_reset(lencoder->choice);
	bit_reset(lencoder->choice2);

	for (pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(lencoder->low[pos_state], LEN_LOW_BITS);
		bittree_reset(lencoder->mid[pos_state], LEN_MID_BITS);
	}

	bittree_reset(lencoder->high, LEN_HIGH_BITS);

	if (!fast_mode)
		for (pos_state = 0; pos_state < num_pos_states;
				++pos_state)
			length_update_prices(lencoder, pos_state);

	return;
}